

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

char * MMDB_strerror(int error_code)

{
  char *pcStack_10;
  int error_code_local;
  
  switch(error_code) {
  case 0:
    pcStack_10 = "Success (not an error)";
    break;
  case 1:
    pcStack_10 = "Error opening the specified MaxMind DB file";
    break;
  case 2:
    pcStack_10 = "The MaxMind DB file\'s search tree is corrupt";
    break;
  case 3:
    pcStack_10 = "The MaxMind DB file contains invalid metadata";
    break;
  case 4:
    pcStack_10 = "An attempt to read data from the MaxMind DB file failed";
    break;
  case 5:
    pcStack_10 = "A memory allocation call failed";
    break;
  case 6:
    pcStack_10 = 
    "The MaxMind DB file is in a format this library can\'t handle (unknown record size or binary format version)"
    ;
    break;
  case 7:
    pcStack_10 = 
    "The MaxMind DB file\'s data section contains bad data (unknown data type or corrupt data)";
    break;
  case 8:
    pcStack_10 = 
    "The lookup path contained an invalid value (like a negative integer for an array index)";
    break;
  case 9:
    pcStack_10 = 
    "The lookup path does not match the data (key that doesn\'t exist, array index bigger than the array, expected array or map where none exists)"
    ;
    break;
  case 10:
    pcStack_10 = 
    "The MMDB_read_node function was called with a node number that does not exist in the search tree"
    ;
    break;
  case 0xb:
    pcStack_10 = "You attempted to look up an IPv6 address in an IPv4-only database";
    break;
  default:
    pcStack_10 = "Unknown error code";
  }
  return pcStack_10;
}

Assistant:

const char *MMDB_strerror(int error_code) {
    switch (error_code) {
        case MMDB_SUCCESS:
            return "Success (not an error)";
        case MMDB_FILE_OPEN_ERROR:
            return "Error opening the specified MaxMind DB file";
        case MMDB_CORRUPT_SEARCH_TREE_ERROR:
            return "The MaxMind DB file's search tree is corrupt";
        case MMDB_INVALID_METADATA_ERROR:
            return "The MaxMind DB file contains invalid metadata";
        case MMDB_IO_ERROR:
            return "An attempt to read data from the MaxMind DB file failed";
        case MMDB_OUT_OF_MEMORY_ERROR:
            return "A memory allocation call failed";
        case MMDB_UNKNOWN_DATABASE_FORMAT_ERROR:
            return "The MaxMind DB file is in a format this library can't "
                   "handle (unknown record size or binary format version)";
        case MMDB_INVALID_DATA_ERROR:
            return "The MaxMind DB file's data section contains bad data "
                   "(unknown data type or corrupt data)";
        case MMDB_INVALID_LOOKUP_PATH_ERROR:
            return "The lookup path contained an invalid value (like a "
                   "negative integer for an array index)";
        case MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR:
            return "The lookup path does not match the data (key that doesn't "
                   "exist, array index bigger than the array, expected array "
                   "or map where none exists)";
        case MMDB_INVALID_NODE_NUMBER_ERROR:
            return "The MMDB_read_node function was called with a node number "
                   "that does not exist in the search tree";
        case MMDB_IPV6_LOOKUP_IN_IPV4_DATABASE_ERROR:
            return "You attempted to look up an IPv6 address in an IPv4-only "
                   "database";
        default:
            return "Unknown error code";
    }
}